

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O3

void __thiscall
mp::pre::
BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
::FillEntryItems(BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
                 *this,EntryItems *ei,LinkEntry *en)

{
  pointer *ppNVar1;
  pointer pNVar2;
  long lVar3;
  iterator iVar4;
  NodeRange local_40;
  
  pNVar2 = (ei->src_items_).
           super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4._M_current =
       (ei->src_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current != pNVar2) {
    (ei->src_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pNVar2;
    iVar4._M_current = pNVar2;
  }
  local_40.pvn_ = (this->ndl_)._M_elems[0];
  local_40.ir_.end_ = en->_M_elems[0] + 1;
  local_40.ir_.beg_ = en->_M_elems[0];
  if (iVar4._M_current ==
      (ei->src_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::
    _M_realloc_insert<mp::pre::NodeRange>(&ei->src_items_,iVar4,&local_40);
  }
  else {
    (iVar4._M_current)->pvn_ = local_40.pvn_;
    (iVar4._M_current)->ir_ = local_40.ir_;
    ppNVar1 = &(ei->src_items_).
               super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  pNVar2 = (ei->dest_items_).
           super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ei->dest_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
      _M_impl.super__Vector_impl_data._M_finish != pNVar2) {
    (ei->dest_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pNVar2;
  }
  lVar3 = 0;
  do {
    local_40.pvn_ = (this->ndl_)._M_elems[lVar3 + 1];
    local_40.ir_.end_ = en->_M_elems[lVar3 + 1] + 1;
    local_40.ir_.beg_ = en->_M_elems[lVar3 + 1];
    iVar4._M_current =
         (ei->dest_items_).
         super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (ei->dest_items_).
        super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::
      _M_realloc_insert<mp::pre::NodeRange>(&ei->dest_items_,iVar4,&local_40);
    }
    else {
      (iVar4._M_current)->pvn_ = local_40.pvn_;
      (iVar4._M_current)->ir_ = local_40.ir_;
      ppNVar1 = &(ei->dest_items_).
                 super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  return;
}

Assistant:

void FillEntryItems(typename Base::EntryItems& ei,
                      const LinkEntry& en) const {
    ei.src_items_.clear();
    int i=0;
    for ( ; i<NSources; ++i)
      ei.src_items_.push_back({ndl_.at(i), en.at(i)});
    ei.dest_items_.clear();
    for ( ; i<NIndexes; ++i)
      ei.dest_items_.push_back({ndl_.at(i), en.at(i)});
  }